

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  
  vVar1 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (&this->left_->fadexpr_,i);
  vVar2 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  return vVar2 + vVar1;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}